

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_contiguous_group_cell
          (REF_GRID ref_grid,REF_INT contiguous_cell,REF_INT *cell_group,REF_INT *cell)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  
  if (contiguous_cell < 0) {
    *cell_group = -1;
  }
  else {
    *cell = contiguous_cell;
    *cell_group = -1;
    uVar3 = *cell;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar1 = ref_grid->cell[lVar2]->n;
      bVar4 = uVar3 < uVar1;
      uVar3 = uVar3 - uVar1;
      if (bVar4 && 0 < (int)uVar1) {
        *cell_group = (REF_INT)lVar2;
        return 0;
      }
      *cell = uVar3;
    }
    if (*cell_group != -1) {
      return 0;
    }
  }
  *cell = -1;
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_group_cell(REF_GRID ref_grid,
                                                  REF_INT contiguous_cell,
                                                  REF_INT *cell_group,
                                                  REF_INT *cell) {
  REF_CELL ref_cell;
  REF_INT group;
  if (contiguous_cell < 0) {
    *cell_group = REF_EMPTY;
    *cell = REF_EMPTY;
    return REF_NOT_FOUND;
  }
  *cell = contiguous_cell;
  *cell_group = REF_EMPTY;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell) && 0 <= *cell &&
        *cell < ref_cell_n(ref_cell)) {
      *cell_group = group;
      break;
    }
    (*cell) -= ref_cell_n(ref_cell);
  }
  if (REF_EMPTY == *cell_group) {
    *cell = REF_EMPTY;
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}